

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_ecdsa_initPEMFromMemory
              (LIBSSH2_SESSION *session,char *privkeyfiledata,size_t privkeyfiledata_len,
              uchar *passphrase,void **abstract)

{
  int iVar1;
  EVP_PKEY *ec_ctx;
  EVP_PKEY *local_38;
  
  local_38 = (EVP_PKEY *)0x0;
  if ((abstract != (void **)0x0) && ((EVP_PKEY *)*abstract != (EVP_PKEY *)0x0)) {
    EVP_PKEY_free((EVP_PKEY *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar1 = _libssh2_ecdsa_new_private_frommemory
                    (&local_38,session,privkeyfiledata,privkeyfiledata_len,passphrase);
  if (abstract == (void **)0x0 || iVar1 != 0) {
    iVar1 = -(uint)(iVar1 != 0);
  }
  else {
    *abstract = local_38;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_initPEMFromMemory(LIBSSH2_SESSION * session,
                                           const char *privkeyfiledata,
                                           size_t privkeyfiledata_len,
                                           unsigned const char *passphrase,
                                           void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = NULL;
    int ret;

    if(abstract && *abstract) {
        hostkey_method_ssh_ecdsa_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_ecdsa_new_private_frommemory(&ec_ctx, session,
                                                privkeyfiledata,
                                                privkeyfiledata_len,
                                                passphrase);
    if(ret) {
        return -1;
    }

    if(abstract)
        *abstract = ec_ctx;

    return 0;
}